

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_chi(uint64_t *A)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t A1;
  uint64_t A0;
  int i;
  uint64_t *A_local;
  
  for (A0._4_4_ = 0; A0._4_4_ < 0x19; A0._4_4_ = A0._4_4_ + 5) {
    uVar1 = A[A0._4_4_];
    uVar2 = A[A0._4_4_ + 1];
    A[A0._4_4_] = (uVar2 ^ 0xffffffffffffffff) & A[A0._4_4_ + 2] ^ A[A0._4_4_];
    A[A0._4_4_ + 1] = (A[A0._4_4_ + 2] ^ 0xffffffffffffffff) & A[A0._4_4_ + 3] ^ A[A0._4_4_ + 1];
    A[A0._4_4_ + 2] = (A[A0._4_4_ + 3] ^ 0xffffffffffffffff) & A[A0._4_4_ + 4] ^ A[A0._4_4_ + 2];
    A[A0._4_4_ + 3] = (A[A0._4_4_ + 4] ^ 0xffffffffffffffff) & uVar1 ^ A[A0._4_4_ + 3];
    A[A0._4_4_ + 4] = (uVar1 ^ 0xffffffffffffffff) & uVar2 ^ A[A0._4_4_ + 4];
  }
  return;
}

Assistant:

static void keccak_chi(uint64_t *A)
{
	int i;
	for (i = 0; i < 25; i += 5) {
		uint64_t A0 = A[0 + i], A1 = A[1 + i];
		A[0 + i] ^= ~A1 & A[2 + i];
		A[1 + i] ^= ~A[2 + i] & A[3 + i];
		A[2 + i] ^= ~A[3 + i] & A[4 + i];
		A[3 + i] ^= ~A[4 + i] & A0;
		A[4 + i] ^= ~A0 & A1;
	}
}